

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
          (TemporaryBuffer *this,uint ch)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->m_cchMax <= this->m_ichCur) {
    Grow(this);
  }
  if (this->m_cchMax <= this->m_ichCur) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                       ,0x2a1,"(m_ichCur < m_cchMax)","m_ichCur < m_cchMax");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = this->m_ichCur;
  this->m_ichCur = uVar1 + 1;
  this->m_prgch[uVar1] = (OLECHAR)ch;
  return;
}

Assistant:

void AppendCh(uint ch)
        {
            if (performAppend)
            {
                if (m_ichCur >= m_cchMax)
                {
                    Grow();
                }

                Assert(m_ichCur < m_cchMax);
                __analysis_assume(m_ichCur < m_cchMax);

                m_prgch[m_ichCur++] = static_cast<OLECHAR>(ch);
            }
        }